

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx2::DiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  byte bVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  Scene *pSVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 local_1b8 [16];
  RayQueryContext *local_1a0;
  Primitive *local_198;
  Scene *local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  RTCFilterFunctionNArguments args;
  uint local_138 [4];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  float local_f8 [4];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar44 [64];
  
  pSVar15 = context->scene;
  local_138[0] = Disc->sharedGeomID;
  pGVar7 = (pSVar15->geometries).items[local_138[0]].ptr;
  lVar8 = *(long *)&pGVar7->field_0x58;
  _Var9 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar17 = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[0] * _Var9);
  auVar19 = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[1] * _Var9);
  auVar21 = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[2] * _Var9);
  auVar22 = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[3] * _Var9);
  auVar11 = vunpcklps_avx(auVar17,auVar21);
  auVar25 = vunpckhps_avx(auVar17,auVar21);
  auVar17 = vunpcklps_avx(auVar19,auVar22);
  auVar33 = vunpckhps_avx(auVar19,auVar22);
  auVar19 = vunpcklps_avx(auVar11,auVar17);
  auVar17 = vunpckhps_avx(auVar11,auVar17);
  auVar23 = vunpcklps_avx(auVar25,auVar33);
  bVar6 = Disc->numPrimitives;
  auVar21._1_3_ = 0;
  auVar21[0] = bVar6;
  auVar21[4] = bVar6;
  auVar21._5_3_ = 0;
  auVar21[8] = bVar6;
  auVar21._9_3_ = 0;
  auVar21[0xc] = bVar6;
  auVar21._13_3_ = 0;
  auVar21 = vpcmpgtd_avx(auVar21,_DAT_01f4ad30);
  local_138[1] = local_138[0];
  local_138[2] = local_138[0];
  local_138[3] = local_138[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22 = vsubps_avx(auVar19,auVar22);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar11 = vsubps_avx(auVar17,auVar19);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar23 = vsubps_avx(auVar23,auVar17);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar18._4_4_ = fVar2;
  auVar18._0_4_ = fVar2;
  auVar18._8_4_ = fVar2;
  auVar18._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar20._4_4_ = fVar3;
  auVar20._0_4_ = fVar3;
  auVar20._8_4_ = fVar3;
  auVar20._12_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar17 = vfmadd231ps_fma(ZEXT416((uint)(fVar4 * fVar4)),auVar20,auVar20);
  auVar17 = vfmadd231ps_fma(auVar17,auVar18,auVar18);
  auVar29._0_4_ = auVar17._0_4_;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  auVar17 = vrcpps_avx(auVar29);
  auVar39._8_4_ = 0x3f800000;
  auVar39._0_8_ = 0x3f8000003f800000;
  auVar39._12_4_ = 0x3f800000;
  auVar19 = vfnmadd231ps_fma(auVar39,auVar17,auVar29);
  auVar17 = vfmadd132ps_fma(auVar19,auVar17,auVar17);
  fVar24 = auVar23._0_4_;
  auVar30._0_4_ = fVar24 * fVar4;
  fVar26 = auVar23._4_4_;
  auVar30._4_4_ = fVar26 * fVar4;
  fVar27 = auVar23._8_4_;
  auVar30._8_4_ = fVar27 * fVar4;
  fVar28 = auVar23._12_4_;
  auVar30._12_4_ = fVar28 * fVar4;
  auVar19 = vfmadd231ps_fma(auVar30,auVar11,auVar20);
  auVar19 = vfmadd231ps_fma(auVar19,auVar22,auVar18);
  local_108._0_4_ = auVar17._0_4_ * auVar19._0_4_;
  local_108._4_4_ = auVar17._4_4_ * auVar19._4_4_;
  local_108._8_4_ = auVar17._8_4_ * auVar19._8_4_;
  local_108._12_4_ = auVar17._12_4_ * auVar19._12_4_;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar17 = vcmpps_avx(auVar36,local_108,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar44 = ZEXT1664(auVar43);
  auVar19 = vcmpps_avx(local_108,auVar43,2);
  auVar17 = vandps_avx(auVar19,auVar17);
  auVar19 = auVar21 & auVar17;
  if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0') {
    auVar17 = vandps_avx(auVar17,auVar21);
    auVar25 = vunpckhps_avx(auVar25,auVar33);
    auVar33._0_4_ = fVar2 * local_108._0_4_;
    auVar33._4_4_ = fVar2 * local_108._4_4_;
    auVar33._8_4_ = fVar2 * local_108._8_4_;
    auVar33._12_4_ = fVar2 * local_108._12_4_;
    auVar37._0_4_ = fVar3 * local_108._0_4_;
    auVar37._4_4_ = fVar3 * local_108._4_4_;
    auVar37._8_4_ = fVar3 * local_108._8_4_;
    auVar37._12_4_ = fVar3 * local_108._12_4_;
    auVar40._0_4_ = fVar4 * local_108._0_4_;
    auVar40._4_4_ = fVar4 * local_108._4_4_;
    auVar40._8_4_ = fVar4 * local_108._8_4_;
    auVar40._12_4_ = fVar4 * local_108._12_4_;
    auVar19 = vsubps_avx(auVar22,auVar33);
    auVar21 = vsubps_avx(auVar11,auVar37);
    auVar23 = vsubps_avx(auVar23,auVar40);
    auVar41._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar41._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar41._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar41._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar21 = vfmadd231ps_fma(auVar41,auVar21,auVar21);
    auVar19 = vfmadd231ps_fma(auVar21,auVar19,auVar19);
    auVar23._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar23._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar23._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar23._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar19 = vcmpps_avx(auVar19,auVar23,2);
    auVar21 = auVar17 & auVar19;
    if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar21[0xf] < '\0')
    {
      auVar19 = vandps_avx(auVar19,auVar17);
      auVar25._0_4_ = fVar24 * fVar24;
      auVar25._4_4_ = fVar26 * fVar26;
      auVar25._8_4_ = fVar27 * fVar27;
      auVar25._12_4_ = fVar28 * fVar28;
      auVar21 = vfmadd213ps_fma(auVar11,auVar11,auVar25);
      auVar21 = vfmadd213ps_fma(auVar22,auVar22,auVar21);
      auVar21 = vcmpps_avx(auVar21,auVar23,6);
      auVar19 = vandps_avx(auVar19,auVar21);
      iVar13 = vmovmskps_avx(auVar19);
      if (iVar13 != 0) {
        local_e8._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_e8._8_4_ = -fVar3;
        local_e8._12_4_ = -fVar3;
        local_d8._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_d8._8_4_ = -fVar4;
        local_d8._12_4_ = -fVar4;
        local_128 = ZEXT1632(ZEXT816(0));
        local_f8[0] = -fVar2;
        local_f8[1] = -fVar2;
        local_f8[2] = -fVar2;
        local_f8[3] = -fVar2;
        uVar16 = (ulong)(byte)iVar13;
        auVar31 = vpcmpeqd_avx2(ZEXT1632(local_108),ZEXT1632(local_108));
        auVar32 = ZEXT3264(auVar31);
        auVar34 = ZEXT864(0) << 0x20;
        auVar17 = vpcmpeqd_avx(auVar17,auVar17);
        auVar35 = ZEXT1664(auVar17);
        auVar38 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        auVar42 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_1a0 = context;
        local_198 = Disc;
        do {
          args.hit = local_c8;
          uVar12 = 0;
          for (uVar14 = uVar16; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            uVar12 = uVar12 + 1;
          }
          local_68 = local_138[uVar12];
          pGVar7 = (pSVar15->geometries).items[local_68].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((local_1a0->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            uVar14 = (ulong)(uint)((int)uVar12 * 4);
            uVar1 = *(undefined4 *)(local_128 + uVar14);
            local_98._4_4_ = uVar1;
            local_98._0_4_ = uVar1;
            local_98._8_4_ = uVar1;
            local_98._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_128 + uVar14 + 0x10);
            local_88._4_4_ = uVar1;
            local_88._0_4_ = uVar1;
            local_88._8_4_ = uVar1;
            local_88._12_4_ = uVar1;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_108 + uVar14);
            args.context = local_1a0->user;
            uVar1 = *(undefined4 *)((long)&(local_198->primIDs).field_0 + uVar14);
            local_78._4_4_ = uVar1;
            local_78._0_4_ = uVar1;
            local_78._8_4_ = uVar1;
            local_78._12_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)local_f8 + uVar14);
            uVar5 = *(undefined4 *)(local_e8 + uVar14);
            local_b8._4_4_ = uVar5;
            local_b8._0_4_ = uVar5;
            local_b8._8_4_ = uVar5;
            local_b8._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_d8 + uVar14);
            local_a8._4_4_ = uVar5;
            local_a8._0_4_ = uVar5;
            local_a8._8_4_ = uVar5;
            local_a8._12_4_ = uVar5;
            local_c8[0] = (RTCHitN)(char)uVar1;
            local_c8[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
            local_c8[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
            local_c8[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
            local_c8[4] = (RTCHitN)(char)uVar1;
            local_c8[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
            local_c8[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
            local_c8[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
            local_c8[8] = (RTCHitN)(char)uVar1;
            local_c8[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
            local_c8[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
            local_c8[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
            local_c8[0xc] = (RTCHitN)(char)uVar1;
            local_c8[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
            local_c8[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
            local_c8[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            uStack_54 = (args.context)->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_48 = (args.context)->instPrimID[0];
            uStack_44 = uStack_48;
            uStack_40 = uStack_48;
            uStack_3c = uStack_48;
            local_1b8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
            args.geometryUserPtr = pGVar7->userPtr;
            args.N = 4;
            local_178 = auVar44._0_16_;
            local_188 = auVar38._0_16_;
            args.valid = (int *)local_1b8;
            args.ray = (RTCRayN *)ray;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar31 = ZEXT1632(auVar32._0_16_);
              auVar17 = auVar35._0_16_;
              local_190 = pSVar15;
              args.valid = (int *)local_1b8;
              (*pGVar7->occlusionFilterN)(&args);
              auVar42 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar38 = ZEXT1664(local_188);
              auVar17 = vpcmpeqd_avx(auVar17,auVar17);
              auVar35 = ZEXT1664(auVar17);
              auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
              auVar32 = ZEXT3264(auVar31);
              auVar44 = ZEXT1664(local_178);
              pSVar15 = local_190;
            }
            auVar17 = auVar35._0_16_;
            if (local_1b8 == (undefined1  [16])0x0) {
              auVar19 = vpcmpeqd_avx(auVar34._0_16_,(undefined1  [16])0x0);
              auVar17 = auVar17 ^ auVar19;
            }
            else {
              p_Var10 = local_1a0->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((local_1a0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                auVar31 = ZEXT1632(auVar32._0_16_);
                (*p_Var10)(&args);
                auVar42 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar38 = ZEXT1664(local_188);
                auVar17 = vpcmpeqd_avx(auVar17,auVar17);
                auVar35 = ZEXT1664(auVar17);
                auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
                auVar32 = ZEXT3264(auVar31);
                auVar44 = ZEXT1664(local_178);
              }
              auVar19 = vpcmpeqd_avx(auVar34._0_16_,local_1b8);
              auVar17 = auVar35._0_16_ ^ auVar19;
              auVar19 = vblendvps_avx(auVar42._0_16_,*(undefined1 (*) [16])(args.ray + 0x80),auVar19
                                     );
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar19;
            }
            if ((auVar38._0_16_ & auVar17) != (undefined1  [16])0x0) {
              return true;
            }
            *(int *)(ray + k * 4 + 0x80) = auVar44._0_4_;
          }
          uVar16 = uVar16 ^ 1L << (uVar12 & 0x3f);
        } while (uVar16 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }